

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_model.c
# Opt level: O2

size_t HTS_Tree_search_node(HTS_Tree *tree,char *string)

{
  HTS_Boolean HVar1;
  HTS_Node *pHVar2;
  
  pHVar2 = tree->root;
  while( true ) {
    if (pHVar2 == (HTS_Node *)0x0) {
      HTS_error(0,"HTS_Tree_search_node: Cannot find node.\n");
      return 1;
    }
    if (pHVar2->quest == (HTS_Question *)0x0) break;
    HVar1 = HTS_Question_match(pHVar2->quest,string);
    if (HVar1 == '\0') {
      pHVar2 = pHVar2->no;
    }
    else {
      pHVar2 = pHVar2->yes;
    }
    if (pHVar2->pdf != 0) {
      return pHVar2->pdf;
    }
  }
  return pHVar2->pdf;
}

Assistant:

static size_t HTS_Tree_search_node(HTS_Tree * tree, const char *string)
{
   HTS_Node *node = tree->root;

   while (node != NULL) {
      if (node->quest == NULL)
         return node->pdf;
      if (HTS_Question_match(node->quest, string)) {
         if (node->yes->pdf > 0)
            return node->yes->pdf;
         node = node->yes;
      } else {
         if (node->no->pdf > 0)
            return node->no->pdf;
         node = node->no;
      }
   }

   HTS_error(0, "HTS_Tree_search_node: Cannot find node.\n");
   return 1;
}